

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O2

void __thiscall
rtosc::ThreadLink::writeArray(ThreadLink *this,char *dest,char *args,rtosc_arg_t *aargs)

{
  ringbuffer_t *ring;
  size_t len;
  size_t sVar1;
  
  len = rtosc_amessage(this->write_buffer,this->MaxMsg,dest,args,aargs);
  ring = this->ring;
  sVar1 = ring_write_size(ring);
  if (sVar1 < len) {
    return;
  }
  ring_write(ring,this->write_buffer,len);
  return;
}

Assistant:

void ThreadLink::writeArray(const char *dest, const char *args, const rtosc_arg_t *aargs)
{
    const size_t len =
        rtosc_amessage(write_buffer, MaxMsg, dest, args, aargs);
    if(ring_write_size(ring) >= len)
        ring_write(ring,write_buffer,len);
}